

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.hpp
# Opt level: O0

char * jessilib::impl::suffix_helper(char *begin,char *end,char *ignored_suffix)

{
  bool bVar1;
  char *local_20;
  char *ignored_suffix_local;
  char *end_local;
  char *begin_local;
  
  local_20 = ignored_suffix;
  end_local = begin;
  while( true ) {
    bVar1 = false;
    if (end_local != end) {
      bVar1 = *end_local == *local_20;
    }
    if (!bVar1) break;
    end_local = end_local + 1;
    local_20 = local_20 + 1;
  }
  return end_local;
}

Assistant:

constexpr const char* suffix_helper(const char* begin, const char* end, const char* ignored_suffix) {
	while (begin != end
		&& *begin == *ignored_suffix) {
		++begin;
		++ignored_suffix;
	}

	return begin;
}